

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

void __thiscall wasm::I64ToI32Lowering::visitSelect(I64ToI32Lowering *this,Select *curr)

{
  bool bVar1;
  Index IVar2;
  Index IVar3;
  pointer this_00;
  pointer pBVar4;
  LocalSet *any;
  pointer pBVar5;
  pointer pBVar6;
  LocalGet *pLVar7;
  Select *pSVar8;
  LocalSet *append;
  LocalGet *ifTrue;
  LocalGet *ifFalse;
  LocalSet *args;
  Block *e;
  unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_> *puVar9;
  Type local_110;
  Type local_108;
  TempVar local_100;
  Type local_e0;
  TempVar local_d8;
  Type local_b8;
  Type local_b0;
  Block *local_a8;
  Block *result;
  undefined1 local_98 [8];
  TempVar cond;
  Type local_68;
  undefined1 local_60 [8];
  TempVar lowBits;
  undefined1 local_38 [8];
  TempVar highBits;
  Select *curr_local;
  I64ToI32Lowering *this_local;
  
  highBits.ty.id = (uintptr_t)curr;
  bVar1 = handleUnreachable(this,(Expression *)curr);
  if (!bVar1) {
    bVar1 = hasOutParam(this,*(Expression **)(highBits.ty.id + 0x10));
    if (bVar1) {
      bVar1 = hasOutParam(this,*(Expression **)(highBits.ty.id + 0x18));
      if (!bVar1) {
        __assert_fail("hasOutParam(curr->ifFalse)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                      ,0x61c,"void wasm::I64ToI32Lowering::visitSelect(Select *)");
      }
      wasm::Type::Type(&lowBits.ty,i32);
      getTemp((TempVar *)local_38,this,lowBits.ty);
      wasm::Type::Type(&local_68,i32);
      getTemp((TempVar *)local_60,this,local_68);
      wasm::Type::Type((Type *)&result,i32);
      getTemp((TempVar *)local_98,this,(Type)result);
      this_00 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                          (&this->builder);
      pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (&this->builder);
      IVar2 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_98);
      any = Builder::makeLocalSet(pBVar4,IVar2,*(Expression **)(highBits.ty.id + 0x20));
      puVar9 = &this->builder;
      pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (puVar9);
      IVar2 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_60);
      pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (puVar9);
      pBVar6 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (puVar9);
      IVar3 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_98);
      wasm::Type::Type(&local_b0,i32);
      pLVar7 = Builder::makeLocalGet(pBVar6,IVar3,local_b0);
      pSVar8 = Builder::makeSelect(pBVar5,(Expression *)pLVar7,
                                   *(Expression **)(highBits.ty.id + 0x10),
                                   *(Expression **)(highBits.ty.id + 0x18));
      append = Builder::makeLocalSet(pBVar4,IVar2,(Expression *)pSVar8);
      puVar9 = &this->builder;
      pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (puVar9);
      IVar2 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_38);
      pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (puVar9);
      pBVar6 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (puVar9);
      IVar3 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_98);
      wasm::Type::Type(&local_b8,i32);
      pLVar7 = Builder::makeLocalGet(pBVar6,IVar3,local_b8);
      pBVar6 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (&this->builder);
      fetchOutParam(&local_d8,this,*(Expression **)(highBits.ty.id + 0x10));
      IVar3 = TempVar::operator_cast_to_unsigned_int(&local_d8);
      wasm::Type::Type(&local_e0,i32);
      ifTrue = Builder::makeLocalGet(pBVar6,IVar3,local_e0);
      pBVar6 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (&this->builder);
      fetchOutParam(&local_100,this,*(Expression **)(highBits.ty.id + 0x18));
      IVar3 = TempVar::operator_cast_to_unsigned_int(&local_100);
      wasm::Type::Type(&local_108,i32);
      ifFalse = Builder::makeLocalGet(pBVar6,IVar3,local_108);
      pSVar8 = Builder::makeSelect(pBVar5,(Expression *)pLVar7,(Expression *)ifTrue,
                                   (Expression *)ifFalse);
      args = Builder::makeLocalSet(pBVar4,IVar2,(Expression *)pSVar8);
      pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (&this->builder);
      IVar2 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_60);
      wasm::Type::Type(&local_110,i32);
      pLVar7 = Builder::makeLocalGet(pBVar4,IVar2,local_110);
      e = Builder::blockify<wasm::LocalSet*,wasm::LocalGet*>
                    (this_00,(Expression *)any,(Expression *)append,args,pLVar7);
      TempVar::~TempVar(&local_100);
      TempVar::~TempVar(&local_d8);
      local_a8 = e;
      setOutParam(this,(Expression *)e,(TempVar *)local_38);
      Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
                (&(this->
                  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                  ).
                  super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                  .
                  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                 ,(Expression *)local_a8);
      TempVar::~TempVar((TempVar *)local_98);
      TempVar::~TempVar((TempVar *)local_60);
      TempVar::~TempVar((TempVar *)local_38);
    }
    else {
      bVar1 = hasOutParam(this,*(Expression **)(highBits.ty.id + 0x18));
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        __assert_fail("!hasOutParam(curr->ifFalse)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                      ,0x619,"void wasm::I64ToI32Lowering::visitSelect(Select *)");
      }
    }
  }
  return;
}

Assistant:

void visitSelect(Select* curr) {
    if (handleUnreachable(curr)) {
      return;
    }
    if (!hasOutParam(curr->ifTrue)) {
      assert(!hasOutParam(curr->ifFalse));
      return;
    }
    assert(hasOutParam(curr->ifFalse));
    TempVar highBits = getTemp();
    TempVar lowBits = getTemp();
    TempVar cond = getTemp();
    Block* result = builder->blockify(
      builder->makeLocalSet(cond, curr->condition),
      builder->makeLocalSet(
        lowBits,
        builder->makeSelect(
          builder->makeLocalGet(cond, Type::i32), curr->ifTrue, curr->ifFalse)),
      builder->makeLocalSet(
        highBits,
        builder->makeSelect(
          builder->makeLocalGet(cond, Type::i32),
          builder->makeLocalGet(fetchOutParam(curr->ifTrue), Type::i32),
          builder->makeLocalGet(fetchOutParam(curr->ifFalse), Type::i32))),
      builder->makeLocalGet(lowBits, Type::i32));
    setOutParam(result, std::move(highBits));
    replaceCurrent(result);
  }